

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplerng.c
# Opt level: O2

double simplerng_getnorm(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  if (simplerng_getnorm_saved != '\0') {
    simplerng_getnorm_saved = 0;
    return simplerng_getnorm::y;
  }
  dVar1 = simplerng_getuniform();
  dVar2 = simplerng_getuniform();
  dVar1 = log(dVar1);
  dVar1 = dVar1 * -2.0;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  dVar3 = cos(dVar2 * 6.283185307179586);
  simplerng_getnorm::y = dVar3 * dVar1;
  simplerng_getnorm_saved = 1;
  dVar2 = sin(dVar2 * 6.283185307179586);
  return dVar2 * dVar1;
}

Assistant:

double simplerng_getnorm()
{
  double u1, u2, r, theta;
  static int saved = 0;
  static double y;

  /* Since you get two deviates for "free" with each calculation, save
     one of them for later */

  if (saved == 0) {
    /* Use Box-Muller algorithm */
    u1 = simplerng_getuniform();
    u2 = simplerng_getuniform();
    r = sqrt( -2.0*log(u1) );
    theta = 2.0*PI*u2;
    /* save second value for next call */
    y = r*cos(theta);
    saved = 1;
    return r*sin(theta);

  } else {
    /* We already saved a value from the last call so use it */
    saved = 0;
    return y;
  }
}